

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scripting_window.cpp
# Opt level: O1

void count_set_proc(Am_Object *cmd)

{
  int value;
  Am_Value *pAVar1;
  ostream *this;
  long *plVar2;
  Am_Object execute_cmd;
  Am_Object counter_widget;
  Am_Object local_20;
  Am_Object local_18;
  
  pAVar1 = Am_Object::Get(cmd,0x170,0);
  Am_Object::Am_Object(&local_18,pAVar1);
  Am_Object::Get_Sibling(&local_20,(Am_Slot_Key)&local_18,(ulong)Am_SCRIPT_EXECUTE_COMMAND);
  pAVar1 = Am_Object::Get(cmd,0x169,0);
  value = Am_Value::operator_cast_to_int(pAVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Setting count of ",0x11)
  ;
  this = operator<<((ostream *)&std::cout,&local_20);
  std::__ostream_insert<char,std::char_traits<char>>(this," to ",4);
  plVar2 = (long *)std::ostream::operator<<(this,value);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::ostream::flush();
  Am_Object::Set(&local_20,Am_EXECUTE_COUNTER,value,0);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, count_set, (Am_Object cmd))
{
  Am_Object counter_widget = cmd.Get(Am_SAVED_OLD_OWNER);
  Am_Object execute_cmd = counter_widget.Get_Sibling(Am_SCRIPT_EXECUTE_COMMAND);
  int val = cmd.Get(Am_VALUE);
  std::cout << "Setting count of " << execute_cmd << " to " << val << std::endl
            << std::flush;
  execute_cmd.Set(Am_EXECUTE_COUNTER, val);
}